

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O0

void __thiscall
webfront::log::
debug<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::debug(debug<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,string_view fmt,basic_string_view<char,_std::char_traits<char>_> *ts,
       basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,srcLoc *l)

{
  bool bVar1;
  
  bVar1 = anon_unknown_4::is('\x04');
  if (bVar1) {
    (anonymous_namespace)::
    log<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string>
              (this._7_1_,fmt,(srcLoc *)ts,(basic_string_view<char,_std::char_traits<char>_> *)ts_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)l);
  }
  return;
}

Assistant:

debug(string_view fmt, Ts&&... ts, const srcLoc& l = srcLoc::current()) {
    if (is(Debug)) log(Debug, fmt, l, std::forward<Ts>(ts)...);
    }